

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O2

ostream * __thiscall bhf::ads::RegistryEntry::Write(RegistryEntry *this,ostream *os)

{
  uint8_t *it;
  size_t sVar1;
  pointer puVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  size_t sVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  byte *pbVar10;
  long lVar11;
  ulong uVar12;
  
  if (this->keyLen != 0) {
    poVar5 = std::operator<<(os,"\n[");
    pmVar6 = std::
             map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at((map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)g_HiveMapping_abi_cxx11_,&this->hive);
    poVar5 = std::operator<<(poVar5,(string *)pmVar6);
    poVar5 = std::operator<<(poVar5,(char *)(this->buffer).
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
    poVar5 = std::operator<<(poVar5,"]\n");
    return poVar5;
  }
  it = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (*it == '\0') {
    std::operator<<(os,'@');
    sVar7 = 1;
  }
  else {
    sVar7 = WriteEscaped(os,it,true);
  }
  pmVar8 = std::
           map<unsigned_int,_bhf::ads::DataMapping,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bhf::ads::DataMapping>_>_>
           ::at((map<unsigned_int,_bhf::ads::DataMapping,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bhf::ads::DataMapping>_>_>
                 *)g_RegTypeMapping,&this->type);
  std::operator<<(os,(string *)pmVar8);
  if (this->type == 4) {
    uVar9 = (long)(this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    for (uVar12 = uVar9 - 4; uVar12 < uVar9; uVar12 = uVar12 + 1) {
    }
    lVar3 = *(long *)os;
    lVar4 = *(long *)(lVar3 + -0x18);
    *(uint *)(os + lVar4 + 0x18) = *(uint *)(os + lVar4 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(os + *(long *)(lVar3 + -0x18) + 0x10) = 8;
    poVar5 = std::operator<<(os,0x30);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  }
  else if (this->type == 1) {
    WriteEscaped(os,(this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -this->dataLen,false);
  }
  else {
    sVar1 = this->dataLen;
    if (sVar1 != 0) {
      lVar11 = sVar7 + (pmVar8->prefix)._M_string_length;
      puVar2 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar3 = *(long *)os;
      lVar4 = *(long *)(lVar3 + -0x18);
      *(uint *)(os + lVar4 + 0x18) = *(uint *)(os + lVar4 + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(os + *(long *)(lVar3 + -0x18) + 0x10) = 2;
      poVar5 = std::operator<<(os,0x30);
      pbVar10 = puVar2 + -sVar1;
      std::ostream::operator<<(poVar5,(uint)*pbVar10);
      while (pbVar10 = pbVar10 + 1,
            pbVar10 !=
            (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish) {
        std::operator<<(os,',');
        uVar12 = lVar11 + 1;
        if (0x4b < uVar12) {
          std::operator<<(os,"\\\n  ");
          uVar12 = 2;
        }
        lVar3 = *(long *)os;
        lVar4 = *(long *)(lVar3 + -0x18);
        *(uint *)(os + lVar4 + 0x18) = *(uint *)(os + lVar4 + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(os + *(long *)(lVar3 + -0x18) + 0x10) = 2;
        poVar5 = std::operator<<(os,0x30);
        std::ostream::operator<<(poVar5,(uint)*pbVar10);
        lVar11 = uVar12 + 2;
      }
    }
  }
  poVar5 = std::operator<<(os,'\n');
  return poVar5;
}

Assistant:

std::ostream& RegistryEntry::Write(std::ostream& os) const
{
    if (keyLen) {
        // RegistryEntry is a registry key, which has no value and is placed in brackets in its own line
        return os << "\n[" << g_HiveMapping.at(hive) << reinterpret_cast<const char*>(buffer.data()) << "]\n";
    }

    size_t currentPos = 0;
    if (!buffer[0]) {
        // RegistryEntry is an anonymous registry value
        os << '@';
        currentPos += 1;
    } else {
        // RegistryEntry is a named registry value
        currentPos += WriteEscaped(os, buffer.data());
    }

    // Now, the actual data follows. First we write the data prefix
    const auto& prefix = g_RegTypeMapping.at(type).prefix;
    os << prefix;
    currentPos += prefix.length();

    // The actual data format depends on the type
    if (type == REG_SZ) {
        const auto dataBegin = buffer.data() + buffer.size() - dataLen;
        WriteEscaped(os, dataBegin, false);
    } else if (type == REG_DWORD) {
        uint32_t val = 0;
        for (size_t i = buffer.size() - sizeof(uint32_t); i < buffer.size(); ++i) {
            val <<= 8;
            val += buffer[i];
        }
        os << std::hex << std::setw(8) << std::setfill('0') << val;
    } else {
        if (dataLen > 0) {
            // Windows always exports 25 pairs of hex bytes (delimited by a comma) on each line
            // including two characters at the start so we do the same.
            constexpr auto lineWrap = 25 * 3 + 1;
            auto dataIt = std::prev(buffer.cend(), dataLen);
            os << std::hex << std::setw(2) << std::setfill('0') << +*dataIt++;
            for ( ; dataIt != buffer.cend(); dataIt++) {
                os << ',';
                currentPos++;
                if (currentPos >= lineWrap) {
                    os << "\\\n  ";
                    currentPos = 2;
                }
                os << std::hex << std::setw(2) << std::setfill('0') << +*dataIt;
                currentPos += 2;
            }
        }
    }
    return os << '\n';
}